

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scapp.h
# Opt level: O1

void __thiscall scApp::validateOptions(scApp *this)

{
  uint uVar1;
  uint uVar2;
  commandOptions *pcVar3;
  ostream *poVar4;
  
  pcVar3 = this->options;
  uVar1 = *(pcVar3->bopts).maxEndpoints.option;
  uVar2 = *(pcVar3->bopts).maxSelectors.option;
  if ((uVar1 == 0) != (uVar2 == 0)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,(string *)&(this->super_ktxApp).name);
    poVar4 = std::operator<<(poVar4,": Both or neither of --max_endpoints and");
    poVar4 = std::operator<<(poVar4," --max_selectors must be specified.");
    std::endl<char,std::char_traits<char>>(poVar4);
    (*(this->super_ktxApp)._vptr_ktxApp[1])(this);
    exit(1);
  }
  if ((uVar1 + uVar2 != 0) && (*(pcVar3->bopts).qualityLevel.option != 0)) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->super_ktxApp).name._M_dataplus._M_p,
                        (this->super_ktxApp).name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,": Warning: ignoring --qlevel as it, --max_endpoints",0x33);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," and --max_selectors are all set.",0x21);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void
scApp::validateOptions() {
    if ((options.bopts.maxEndpoints == 0) ^ (options.bopts.maxSelectors == 0)) {
        cerr << name << ": Both or neither of --max_endpoints and"
             << " --max_selectors must be specified." << endl;
        usage();
        exit(1);
    }
    if (options.bopts.qualityLevel
        && (options.bopts.maxEndpoints + options.bopts.maxSelectors)) {
        cerr << name << ": Warning: ignoring --qlevel as it, --max_endpoints"
             << " and --max_selectors are all set." << endl;
    }
}